

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tables.c
# Opt level: O2

int main(void)

{
  amqp_field_value_t v;
  amqp_field_value_t v_00;
  amqp_field_value_t v_01;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  FILE *__s;
  size_t sVar5;
  size_t sVar6;
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar7;
  int *piVar8;
  ulong extraout_RAX;
  undefined8 uVar9;
  undefined8 extraout_RAX_00;
  char *pcVar10;
  ulong uVar11;
  amqp_field_value_t *paVar12;
  ulong uVar13;
  bool bVar14;
  undefined4 uVar15;
  amqp_bytes_t encoded;
  amqp_bytes_t encoded_00;
  byte in_stack_ffffffffffffdec0;
  byte in_stack_ffffffffffffdec8;
  undefined1 in_stack_ffffffffffffdec9;
  undefined2 in_stack_ffffffffffffdeca;
  uint in_stack_ffffffffffffdecc;
  FILE *local_2130;
  amqp_table_t table;
  amqp_table_t decoded;
  size_t decoding_offset;
  amqp_pool_t pool;
  undefined1 local_20b8 [8];
  undefined4 local_20b0;
  undefined1 local_20a0;
  undefined8 local_2098;
  char *local_2090;
  undefined8 local_2088;
  char *local_2080;
  undefined1 local_2078;
  undefined4 local_2070;
  undefined8 local_2060;
  char *local_2058;
  undefined1 local_2050;
  undefined8 local_2048;
  char *local_2040;
  amqp_field_value_t val;
  undefined1 local_1038 [24];
  undefined1 local_1020 [16];
  undefined8 local_1010;
  char *local_1008;
  undefined1 local_1000;
  undefined4 local_ff8;
  undefined8 local_fe8;
  char *local_fe0;
  undefined1 local_fd8;
  undefined1 local_fd0;
  undefined4 local_fcc;
  undefined8 local_fc0;
  char *local_fb8;
  undefined1 local_fb0;
  undefined8 local_fa8;
  undefined8 local_f98;
  char *local_f90;
  undefined1 local_f88;
  undefined4 local_f80;
  undefined8 *local_f78;
  undefined8 local_f70;
  char *local_f68;
  undefined1 local_f60;
  undefined1 local_f58;
  undefined8 local_f48;
  char *local_f40;
  undefined1 local_f38;
  undefined8 local_f30;
  undefined8 local_f20;
  char *local_f18;
  undefined1 local_f10;
  undefined2 local_f08;
  undefined8 local_ef8;
  char *local_ef0;
  undefined1 local_ee8;
  undefined4 local_ee0;
  undefined8 local_ed0;
  char *local_ec8;
  undefined1 local_ec0;
  undefined8 local_eb8;
  char *local_eb0;
  undefined8 local_ea8;
  char *local_ea0;
  undefined1 local_e98;
  undefined8 local_e80;
  char *local_e78;
  undefined1 local_e70;
  undefined4 local_e68;
  undefined1 *local_e60;
  undefined8 local_e58;
  char *local_e50;
  undefined1 local_e48;
  undefined4 local_e40;
  undefined8 local_e30;
  char *local_e28;
  undefined1 local_e20;
  undefined8 local_e18;
  
  pcVar4 = getenv("srcdir");
  __s = tmpfile();
  if (__s == (FILE *)0x0) {
LAB_00102b95:
    piVar8 = __errno_location();
    pcVar4 = strerror(*piVar8);
    pcVar10 = "failed to create temporary file: %s";
LAB_00102bc8:
    die(pcVar10,pcVar4);
LAB_00102bd2:
    pcVar4 = "Offset should be %ld, was %ld";
    __stream = (FILE *)0x103;
  }
  else {
    local_f78 = &local_2088;
    local_2088 = 3;
    local_2080 = "one";
    local_2078 = 0x49;
    local_2070 = 0xd431;
    local_2060 = 3;
    local_2058 = "two";
    local_2050 = 0x53;
    local_2048 = 0xd;
    local_2040 = "A long string";
    local_e60 = local_20b8;
    local_20b8[0] = 0x49;
    local_20b0 = 0xd431;
    local_20a0 = 0x53;
    local_2098 = 0xd;
    local_2090 = "A long string";
    table.entries = (amqp_table_entry_t_ *)local_1038;
    local_1038._0_8_ = 7;
    local_1038._8_8_ = "longstr";
    local_1038[0x10] = 0x53;
    local_1020._0_8_ = 0x15;
    local_1020._8_8_ = "Here is a long string";
    local_1010 = 9;
    local_1008 = "signedint";
    local_1000 = 0x49;
    local_ff8 = 0x3039;
    local_fe8 = 7;
    local_fe0 = "decimal";
    local_fd8 = 0x44;
    local_fd0 = 3;
    local_fcc = 0x1e240;
    local_fc0 = 9;
    local_fb8 = "timestamp";
    local_fb0 = 0x54;
    local_fa8 = 0x63eea053c194;
    local_f98 = 5;
    local_f90 = "table";
    local_f88 = 0x46;
    local_f80 = 2;
    local_f70 = 4;
    local_f68 = "byte";
    local_f60 = 0x62;
    local_f58 = 0xff;
    local_f48 = 4;
    local_f40 = "long";
    local_f38 = 0x6c;
    local_f30 = 0x499602d2;
    local_f20 = 5;
    local_f18 = "short";
    local_f10 = 0x73;
    local_f08 = 0x28f;
    local_ef8 = 4;
    local_ef0 = "bool";
    local_ee8 = 0x74;
    local_ee0 = 1;
    local_ed0 = 6;
    local_ec8 = "binary";
    local_ec0 = 0x78;
    local_eb8 = 0xf;
    local_eb0 = "a binary string";
    local_ea8 = 4;
    local_ea0 = "void";
    local_e98 = 0x56;
    local_e80 = 5;
    local_e78 = "array";
    local_e70 = 0x41;
    local_e58 = 5;
    local_e50 = "float";
    local_e48 = 0x66;
    local_e40 = 0x40490fdb;
    local_e30 = 6;
    local_e28 = "double";
    local_e20 = 100;
    local_e18 = 0x400921fb54442d18;
    table.num_entries = 0xe;
    local_e68 = local_f80;
    fwrite("AAAAAAAAAA\n",0xb,1,__s);
    val.kind = 'F';
    val.value.i64 = CONCAT44(table._4_4_,table.num_entries);
    val.value.table.entries = table.entries;
    in_stack_ffffffffffffdec8 = (byte)table.entries;
    in_stack_ffffffffffffdec9 = (undefined1)((ulong)table.entries >> 8);
    in_stack_ffffffffffffdeca = (undefined2)((ulong)table.entries >> 0x10);
    in_stack_ffffffffffffdecc = (uint)((ulong)table.entries >> 0x20);
    in_stack_ffffffffffffdec0 = (byte)table.num_entries;
    v.value.i8 = in_stack_ffffffffffffdec0;
    v.kind = 'F';
    v._1_7_ = val._1_7_;
    v.value.i64._1_7_ = (int7)(val.value.u64 >> 8);
    v.value._8_1_ = in_stack_ffffffffffffdec8;
    v.value._9_1_ = in_stack_ffffffffffffdec9;
    v.value._10_2_ = in_stack_ffffffffffffdeca;
    v.value._12_4_ = in_stack_ffffffffffffdecc;
    dump_value(0,v,(FILE *)__s);
    init_amqp_pool(&pool,0x1000);
    decoding_offset = 0;
    encoded.bytes = pre_encoded_table;
    encoded.len = 0x103;
    iVar1 = amqp_decode_table(encoded,&pool,&decoded,&decoding_offset);
    if (iVar1 < 0) {
      pcVar4 = amqp_error_string2(iVar1);
      pcVar10 = "Table decoding failed: %s";
      goto LAB_00102bc8;
    }
    fwrite("BBBBBBBBBB\n",0xb,1,__s);
    val.kind = 'F';
    val.value.i64 = decoded._0_8_;
    val.value.table.entries = decoded.entries;
    in_stack_ffffffffffffdec8 = (byte)decoded.entries;
    in_stack_ffffffffffffdec9 = (undefined1)((ulong)decoded.entries >> 8);
    in_stack_ffffffffffffdeca = (undefined2)((ulong)decoded.entries >> 0x10);
    in_stack_ffffffffffffdecc = (uint)((ulong)decoded.entries >> 0x20);
    in_stack_ffffffffffffdec0 = (byte)decoded.num_entries;
    v_00.value.i8 = in_stack_ffffffffffffdec0;
    v_00.kind = 'F';
    v_00._1_7_ = val._1_7_;
    v_00.value.i64._1_7_ = decoded._1_7_;
    v_00.value._8_1_ = in_stack_ffffffffffffdec8;
    v_00.value._9_1_ = in_stack_ffffffffffffdec9;
    v_00.value._10_2_ = in_stack_ffffffffffffdeca;
    v_00.value._12_4_ = in_stack_ffffffffffffdecc;
    dump_value(0,v_00,(FILE *)__s);
    decoded.num_entries = 0;
    decoded._4_4_ = 0;
    memset(&val,0,0x1000);
    encoded_00.bytes = &val;
    encoded_00.len = 0x1000;
    iVar1 = amqp_encode_table(encoded_00,&table,(size_t *)&decoded);
    local_2130 = __s;
    if (iVar1 < 0) {
      pcVar4 = amqp_error_string2(iVar1);
      pcVar10 = "Table encoding failed: %s";
      goto LAB_00102bc8;
    }
    if (decoded._0_8_ != 0x103) goto LAB_00102bd2;
    uVar2 = memcmp(pre_encoded_table,&val,0x103);
    if (uVar2 != 0) {
      die("Table encoding differed",(ulong)uVar2);
LAB_00102bf0:
      pcVar4 = "out of memory";
LAB_00102b8e:
      die(pcVar4);
      goto LAB_00102b95;
    }
    empty_amqp_pool(&pool);
    fwrite("----------\n",0xb,1,__s);
    val.kind = '\x05';
    val._1_7_ = 0;
    val.value.f64 = (double)anon_var_dwarf_346;
    val.value._8_1_ = 0x53;
    qsort(&val,8,0x28,amqp_table_entry_cmp);
    local_1038[0] = 0x46;
    local_1038._8_4_ = 8;
    in_stack_ffffffffffffdec8 = (byte)&val;
    in_stack_ffffffffffffdec9 = (undefined1)((ulong)&val >> 8);
    in_stack_ffffffffffffdeca = (undefined2)((ulong)&val >> 0x10);
    in_stack_ffffffffffffdecc = (uint)((ulong)&val >> 0x20);
    in_stack_ffffffffffffdec0 = 8;
    v_01.value.i8 = 8;
    v_01._0_8_ = local_1038._0_8_;
    v_01.value.i64._1_7_ = SUB87(local_1038._8_8_,1);
    v_01.value._8_1_ = in_stack_ffffffffffffdec8;
    v_01.value._9_1_ = in_stack_ffffffffffffdec9;
    v_01.value._10_2_ = in_stack_ffffffffffffdeca;
    v_01.value._12_4_ = in_stack_ffffffffffffdecc;
    local_1038._16_8_ = &val;
    dump_value(0,v_01,(FILE *)__s);
    pcVar10 = ".";
    if (pcVar4 != (char *)0x0) {
      pcVar10 = pcVar4;
    }
    sVar5 = strlen(pcVar10);
    pcVar4 = expected_file_name;
    sVar6 = strlen(expected_file_name);
    __stream = (FILE *)malloc(sVar5 + sVar6 + 2);
    if (__stream == (FILE *)0x0) goto LAB_00102bf0;
    sprintf((char *)__stream,"%s/%s",pcVar10,pcVar4);
    __stream_00 = fopen((char *)__stream,"r");
    if (__stream_00 != (FILE *)0x0) {
      rewind(__stream_00);
      rewind(__s);
      do {
        sVar6 = fread(&val,1,0x1000,__stream_00);
        sVar7 = fread(local_1038,1,0x1000,__s);
        sVar5 = sVar7;
        if (sVar6 < sVar7) {
          sVar5 = sVar6;
        }
        iVar1 = bcmp(&val,local_1038,sVar5);
        if (iVar1 != 0) goto LAB_00102b87;
      } while ((0xfff < sVar6) && (0xfff < sVar7));
      if (sVar6 == sVar7) {
        fclose(__stream_00);
        free(__stream);
        fclose(__s);
        return 0;
      }
LAB_00102b87:
      pcVar4 = "output file did not have expected contents";
      goto LAB_00102b8e;
    }
    piVar8 = __errno_location();
    strerror(*piVar8);
    pcVar4 = "failed to open %s: %s";
  }
  die(pcVar4);
  iVar1 = (int)pcVar4;
  dump_indent(iVar1,(FILE *)__stream);
  uVar2 = (uint)in_stack_ffffffffffffdec0;
  fputc(uVar2,__stream);
  switch(uVar2) {
  case 0x62:
    uVar13 = (ulong)(uint)(int)(char)in_stack_ffffffffffffdec8;
    break;
  case 99:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
switchD_00102c69_caseD_43:
    sVar5 = fwrite("???\n",4,1,__stream);
    return (int)sVar5;
  case 100:
    uVar15 = CONCAT22(in_stack_ffffffffffffdeca,
                      CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
    goto LAB_00102dc7;
  case 0x66:
    uVar15 = SUB84((double)(float)CONCAT22(in_stack_ffffffffffffdeca,
                                           CONCAT11(in_stack_ffffffffffffdec9,
                                                    in_stack_ffffffffffffdec8)),0);
LAB_00102dc7:
    iVar1 = fprintf(__stream," %g\n",uVar15);
    return iVar1;
  case 0x69:
    uVar13 = (ulong)CONCAT22(in_stack_ffffffffffffdeca,
                             CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
    goto LAB_00102ebd;
  case 0x6c:
    pcVar4 = " %ld\n";
LAB_00102f1f:
    iVar1 = fprintf(__stream,pcVar4,
                    CONCAT44(in_stack_ffffffffffffdecc,
                             CONCAT22(in_stack_ffffffffffffdeca,
                                      CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8))
                            ));
    return iVar1;
  case 0x73:
    uVar13 = (ulong)(uint)(int)CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8);
    break;
  case 0x74:
    pcVar4 = " true\n";
    if (CONCAT22(in_stack_ffffffffffffdeca,
                 CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8)) == 0) {
      pcVar4 = " false\n";
    }
    iVar1 = fputs(pcVar4,__stream);
    return iVar1;
  case 0x75:
    uVar13 = (ulong)CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8);
LAB_00102ebd:
    pcVar4 = " %u\n";
    goto LAB_00102ed2;
  default:
    switch(uVar2) {
    case 0x41:
      fputc(10,__stream);
      uVar2 = CONCAT22(in_stack_ffffffffffffdeca,
                       CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
      uVar13 = (ulong)uVar2;
      uVar11 = 0;
      if (0 < (int)uVar2) {
        uVar11 = (ulong)uVar2;
      }
      while( true ) {
        iVar3 = (int)uVar13;
        bVar14 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar14) break;
        dump_value(iVar1 + 2,*(amqp_field_value_t *)local_2130,(FILE *)__stream);
        local_2130 = (FILE *)&local_2130->_IO_read_base;
        uVar13 = extraout_RAX;
      }
      break;
    case 0x42:
      uVar13 = (ulong)in_stack_ffffffffffffdec8;
      goto LAB_00102ebd;
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
      goto switchD_00102c69_caseD_43;
    case 0x44:
      iVar1 = fprintf(__stream," %u:::%u\n",(ulong)in_stack_ffffffffffffdec8,
                      (ulong)in_stack_ffffffffffffdecc);
      return iVar1;
    case 0x46:
      fputc(10,__stream);
      uVar2 = CONCAT22(in_stack_ffffffffffffdeca,
                       CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
      uVar9 = 0;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      uVar13 = (ulong)uVar2;
      paVar12 = (amqp_field_value_t *)&local_2130->_IO_read_end;
      while( true ) {
        iVar3 = (int)uVar9;
        bVar14 = uVar13 == 0;
        uVar13 = uVar13 - 1;
        if (bVar14) break;
        dump_indent(iVar1 + 2,(FILE *)__stream);
        fprintf(__stream,"%.*s ->\n",(ulong)paVar12[-1].value.u32,paVar12[-1].value.bytes.bytes);
        dump_value(iVar1 + 4,*paVar12,(FILE *)__stream);
        paVar12 = (amqp_field_value_t *)((long)&paVar12[1].value + 8);
        uVar9 = extraout_RAX_00;
      }
      break;
    case 0x49:
      uVar13 = (ulong)CONCAT22(in_stack_ffffffffffffdeca,
                               CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
      goto LAB_00102ecb;
    default:
      if (in_stack_ffffffffffffdec0 == 0x53) {
        iVar1 = fprintf(__stream," %.*s\n",
                        (ulong)CONCAT22(in_stack_ffffffffffffdeca,
                                        CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8
                                                )),local_2130);
        return iVar1;
      }
      if (uVar2 != 0x54) {
        if (uVar2 != 0x56) {
          if (uVar2 != 0x78) goto switchD_00102c69_caseD_43;
          fputc(0x20,__stream);
          uVar2 = CONCAT22(in_stack_ffffffffffffdeca,
                           CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
            fprintf(__stream,"%02x",
                    (ulong)(uint)(int)(char)*(uint8_t *)((long)&local_2130->_flags + uVar13));
          }
        }
        iVar1 = fputc(10,__stream);
        return iVar1;
      }
      pcVar4 = " %lu\n";
      goto LAB_00102f1f;
    }
    return iVar3;
  }
LAB_00102ecb:
  pcVar4 = " %d\n";
LAB_00102ed2:
  iVar1 = fprintf(__stream,pcVar4,uVar13);
  return iVar1;
}

Assistant:

int main(void) {
  char *srcdir = getenv("srcdir");
  FILE *out, *expected = NULL;
  char *expected_path;

  out = tmpfile();
  if (out == NULL) {
    die("failed to create temporary file: %s", strerror(errno));
  }

  test_table_codec(out);
  fprintf(out, "----------\n");
  test_dump_value(out);

  if (srcdir == NULL) {
    srcdir = ".";
  }

  expected_path = malloc(strlen(srcdir) + strlen(expected_file_name) + 2);
  if (!expected_path) {
    die("out of memory");
  }
  sprintf(expected_path, "%s/%s", srcdir, expected_file_name);
  expected = fopen(expected_path, "r");
  if (!expected) {
    die("failed to open %s: %s", expected_path, strerror(errno));
  }

  if (compare_files(expected, out)) {
    die("output file did not have expected contents");
  }

  fclose(expected);
  free(expected_path);
  fclose(out);

  return 0;
}